

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationShaderInputOutputTests.cpp
# Opt level: O0

TestStatus *
vkt::tessellation::anon_unknown_1::PerPatchData::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDefinition *caseDef)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  TestContext *this;
  Archive *archive;
  char *fileName;
  float fVar4;
  float fVar5;
  ConstPixelBufferAccess local_b8;
  undefined1 local_90 [8];
  TextureLevel referenceImage;
  int i;
  VkDeviceSize vertexBufferSize;
  allocator<float> local_45;
  value_type_conflict3 local_44;
  undefined1 local_40 [8];
  vector<float,_std::allocator<float>_> vertexData;
  int numPrimitives;
  CaseDefinition *caseDef_local;
  Context *context_local;
  
  vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = getNumPrimitives(caseDef->caseType);
  iVar1 = vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ * 10;
  local_44 = 0.0;
  std::allocator<float>::allocator(&local_45);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_40,(long)iVar1,&local_44,&local_45);
  std::allocator<float>::~allocator(&local_45);
  sVar2 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)local_40);
  for (referenceImage.m_data.m_cap._4_4_ = 0;
      referenceImage.m_data.m_cap._4_4_ <
      vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_;
      referenceImage.m_data.m_cap._4_4_ = referenceImage.m_data.m_cap._4_4_ + 1) {
    fVar4 = (float)referenceImage.m_data.m_cap._4_4_;
    fVar5 = (float)vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_40,
                        (long)(referenceImage.m_data.m_cap._4_4_ * 10));
    *pvVar3 = fVar4 / fVar5;
  }
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_90);
  if ((caseDef->usesReferenceImageFromFile & 1U) == 0) {
    initializeWhiteReferenceImage((TextureLevel *)local_90,0x100,0x100);
  }
  else {
    this = Context::getTestContext(context);
    archive = tcu::TestContext::getArchive(this);
    fileName = (char *)std::__cxx11::string::c_str();
    tcu::ImageIO::loadPNG((TextureLevel *)local_90,archive,fileName);
  }
  iVar1 = vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_40,0);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_b8,(TextureLevel *)local_90);
  runTest(__return_storage_ptr__,context,iVar1,10,5,VK_FORMAT_R32_SFLOAT,pvVar3,sVar2 << 2,&local_b8
         );
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_90);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDefinition caseDef)
{
	DE_ASSERT(!caseDef.usesReferenceImageFromFile || !caseDef.referenceImagePath.empty());

	// Input vertex attribute data
	const int		   numPrimitives	= getNumPrimitives(caseDef.caseType);
	std::vector<float> vertexData		(INPUT_PATCH_SIZE * numPrimitives, 0.0f);
	const VkDeviceSize vertexBufferSize = sizeof(float) * vertexData.size();

	for (int i = 0; i < numPrimitives; ++i)
		vertexData[INPUT_PATCH_SIZE * i] = static_cast<float>(i) / static_cast<float>(numPrimitives);

	tcu::TextureLevel referenceImage;
	if (caseDef.usesReferenceImageFromFile)
		tcu::ImageIO::loadPNG(referenceImage, context.getTestContext().getArchive(), caseDef.referenceImagePath.c_str());
	else
		initializeWhiteReferenceImage(referenceImage, RENDER_SIZE, RENDER_SIZE);

	return runTest(context, numPrimitives, INPUT_PATCH_SIZE, OUTPUT_PATCH_SIZE,
				   VK_FORMAT_R32_SFLOAT, &vertexData[0], vertexBufferSize, referenceImage.getAccess());
}